

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O2

void __thiscall
ddd::DaTrie<true,_false,_false>::insert_tail_(DaTrie<true,_false,_false> *this,Query *query)

{
  pointer pBVar1;
  undefined8 in_RAX;
  uint uVar2;
  long lVar3;
  bool bVar4;
  undefined8 uStack_28;
  
  if (query->is_finished_ == true) {
    pBVar1 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
             super__Vector_impl_data._M_start;
    pBVar1[query->node_pos_] =
         (Bc)((ulong)pBVar1[query->node_pos_] & 0xffffffff00000000 | (ulong)query->value_ |
             0x80000000);
  }
  else {
    pBVar1 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
             super__Vector_impl_data._M_start;
    pBVar1[query->node_pos_] =
         (Bc)((ulong)(uint)(*(int *)&(this->tail_).super__Vector_base<char,_std::allocator<char>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                           *(int *)&(this->tail_).super__Vector_base<char,_std::allocator<char>_>.
                                    _M_impl.super__Vector_impl_data._M_start) |
              (ulong)pBVar1[query->node_pos_] & 0xffffffff00000000 | 0x80000000);
    uStack_28 = in_RAX;
    while (query->is_finished_ == false) {
      uStack_28 = CONCAT17(query->key_[query->pos_],(undefined7)uStack_28);
      std::vector<char,_std::allocator<char>_>::emplace_back<char>
                (&this->tail_,(char *)((long)&uStack_28 + 7));
      Query::next(query);
    }
    uVar2 = query->value_;
    lVar3 = 4;
    while (bVar4 = lVar3 != 0, lVar3 = lVar3 + -1, bVar4) {
      uStack_28._0_7_ = CONCAT16((char)uVar2,(undefined6)uStack_28);
      std::vector<char,_std::allocator<char>_>::emplace_back<char>
                (&this->tail_,(char *)((long)&uStack_28 + 6));
      uVar2 = uVar2 >> 8;
    }
  }
  return;
}

Assistant:

void insert_tail_(Query& query) {
    assert(query.node_pos() < bc_.size());
    assert(bc_[query.node_pos()].is_fixed());

    if (query.is_finished()) {
      bc_[query.node_pos()].set_value(query.value());
      return;
    }

    auto tail_pos = tail_size();
    bc_[query.node_pos()].set_value(tail_pos);

    while (!query.is_finished()) {
      tail_.push_back(query.label());
      query.next();
    }

    auto value = query.value();
    for (size_t i = 0; i < sizeof(uint32_t); ++i) {
      tail_.push_back(static_cast<uint8_t>(value & 0xFF));
      value >>= 8;
    }
  }